

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_fast_socket_nonblocking(int fd)

{
  int iVar1;
  int local_c;
  int fd_local;
  
  iVar1 = fcntl(fd,4,0x800);
  if (iVar1 == -1) {
    event_warn("fcntl(%d, F_SETFL)",(ulong)(uint)fd);
    local_c = -1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int
evutil_fast_socket_nonblocking(evutil_socket_t fd)
{
#ifdef _WIN32
	return evutil_make_socket_nonblocking(fd);
#else
	if (fcntl(fd, F_SETFL, O_NONBLOCK) == -1) {
		event_warn("fcntl(%d, F_SETFL)", fd);
		return -1;
	}
	return 0;
#endif
}